

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O3

void __thiscall
diffusion::NetReader::NetReader
          (NetReader *this,string *destination_ip_address,string *destination_port)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int ***ppp_Var1;
  undefined1 auVar2 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Receiver *this_01;
  execution_context eVar4;
  service *psVar5;
  type *in_R8;
  io_service io_service;
  socket socket;
  resolver resolver;
  io_context local_180;
  undefined1 local_170 [24];
  data_union local_158;
  undefined1 local_138 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_130 [5];
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_c0;
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_70;
  
  (this->super_Reader)._vptr_Reader = (_func_int **)&PTR_can_read_0012ade8;
  (this->receiver_).super___shared_ptr<diffusion::Receiver,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->receiver_).super___shared_ptr<diffusion::Receiver,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->receiver_thread_)._M_id._M_thread = 0;
  (this->data_queue_).unprocessed_data_._M_dataplus._M_p =
       (pointer)&(this->data_queue_).unprocessed_data_.field_2;
  (this->data_queue_).unprocessed_data_._M_string_length = 0;
  (this->data_queue_).unprocessed_data_.field_2._M_local_buf[0] = '\0';
  (this->data_queue_).queue_mutex_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->data_queue_).queue_mutex_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->data_queue_).queue_mutex_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->data_queue_).queue_mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->data_queue_).queue_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->data_queue_).processed_data_queue_.
  super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->data_queue_).processed_data_queue_.
  super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->data_queue_).processed_data_queue_.
  super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->data_queue_).processed_data_queue_.
  super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->data_queue_).processed_data_queue_.
  super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->data_queue_).processed_data_queue_.
  super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->data_queue_).processed_data_queue_.
  super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->data_queue_).processed_data_queue_.
  super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->data_queue_).processed_data_queue_.
  super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->data_queue_).processed_data_queue_.
  super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&(this->data_queue_).processed_data_queue_.
                       super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                      ,0);
  boost::asio::io_context::io_context(&local_180);
  local_138 = (undefined1  [8])
              &boost::asio::detail::
               typeid_wrapper<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>>::
               typeinfo;
  a_Stack_130[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c0.service_ =
       (service_type *)
       boost::asio::detail::service_registry::do_use_service
                 (local_180.super_execution_context.service_registry_,(key *)local_138,
                  boost::asio::detail::service_registry::
                  create<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,boost::asio::io_context>
                  ,&local_180);
  local_c0.executor_.super_any_executor_base.target_ = &local_c0.executor_;
  local_c0.implementation_.protocol_.family_ = 2;
  local_c0.executor_.super_any_executor_base.target_fns_ =
       (target_fns *)
       boost::asio::execution::detail::any_executor_base::
       target_fns_table<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>(bool,std::enable_if<!is_same<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value,void>::type*)
       ::fns_with_execute;
  local_c0.executor_.super_any_executor_base.object_fns_ =
       (object_fns *)
       boost::asio::execution::detail::any_executor_base::
       object_fns_table<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>(std::enable_if<(!is_same<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value)&&(!is_same<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>,std::shared_ptr<void>>::value),void>::type*)
       ::fns;
  local_c0.executor_.super_any_executor_base.object_._12_4_ = 0;
  local_c0.executor_.prop_fns_ =
       (prop_fns<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)boost::asio::execution::
          any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>
          ::prop_fns_table<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>()
          ::fns;
  local_c0.implementation_.super_base_implementation_type.socket_ = -1;
  local_c0.implementation_.super_base_implementation_type.state_ = '\0';
  local_c0.executor_.super_any_executor_base.object_.__align =
       (anon_struct_8_0_00000001_for___align)&local_180;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&local_70,&local_180,(type *)0x0);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<boost::asio::ip::tcp> *)local_138,destination_ip_address,
             destination_port,address_configured);
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::resolve((results_type *)local_170,
            (basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)&local_70,(query *)local_138);
  boost::asio::
  connect<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>>
            ((endpoint *)&local_158.base,(asio *)&local_c0,
             (basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_170,(basic_resolver_results<boost::asio::ip::tcp> *)0x0,in_R8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p != &local_d8) {
    operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
  }
  this_01 = (Receiver *)operator_new(0x60);
  Receiver::Receiver(this_01,(socket *)&local_c0,&this->data_queue_);
  local_138 = (undefined1  [8])this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<diffusion::Receiver*>
            (a_Stack_130,this_01);
  _Var3._M_pi = a_Stack_130[0]._M_pi;
  auVar2 = local_138;
  local_138 = (undefined1  [8])0x0;
  a_Stack_130[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->receiver_).super___shared_ptr<diffusion::Receiver,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->receiver_).super___shared_ptr<diffusion::Receiver,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar2;
  (this->receiver_).super___shared_ptr<diffusion::Receiver,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((target_fns *)a_Stack_130[0]._M_pi != (target_fns *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_130[0]._M_pi);
    }
  }
  local_158._0_8_ = 0;
  local_138 = (undefined1  [8])operator_new(0x10);
  *(undefined ***)local_138 = &PTR___State_0012ae38;
  *(NetReader **)((long)local_138 + 8) = this;
  std::thread::_M_start_thread(&local_158,local_138,0);
  if (local_138 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_138 + 8))();
  }
  if ((this->receiver_thread_)._M_id._M_thread != 0) {
    std::terminate();
  }
  (this->receiver_thread_)._M_id._M_thread = local_158._0_8_;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&local_70);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&local_c0);
  psVar5 = (local_180.super_execution_context.service_registry_)->first_service_;
  eVar4.service_registry_ = local_180.super_execution_context.service_registry_;
  if (psVar5 != (service *)0x0) {
    do {
      (*psVar5->_vptr_service[2])(psVar5);
      eVar4.service_registry_ = local_180.super_execution_context.service_registry_;
      psVar5 = psVar5->next_;
    } while (psVar5 != (service *)0x0);
    psVar5 = (local_180.super_execution_context.service_registry_)->first_service_;
    if (psVar5 != (service *)0x0) {
      do {
        ppp_Var1 = &psVar5->_vptr_service;
        psVar5 = psVar5->next_;
        (*(*ppp_Var1)[1])();
        (eVar4.service_registry_)->first_service_ = psVar5;
      } while (psVar5 != (service *)0x0);
      eVar4.service_registry_ = local_180.super_execution_context.service_registry_;
      if (local_180.super_execution_context.service_registry_ == (service_registry *)0x0) {
        eVar4.service_registry_ = (service_registry *)0x0;
        goto LAB_00119fdc;
      }
    }
  }
  pthread_mutex_destroy((pthread_mutex_t *)&(eVar4.service_registry_)->mutex_);
LAB_00119fdc:
  operator_delete(eVar4.service_registry_,0x40);
  return;
}

Assistant:

NetReader::NetReader(std::string const & destination_ip_address, std::string destination_port) {
    boost::asio::io_service io_service;;
    boost::asio::ip::tcp::socket socket(io_service);
    boost::asio::ip::tcp::resolver resolver(io_service);
    try {
        boost::asio::connect(socket, resolver.resolve({destination_ip_address, destination_port}));
    } catch (std::exception const & e) {
        throw ErrorNoWriter();
    }
    receiver_ = std::shared_ptr<Receiver>(new Receiver(std::move(socket), data_queue_));
    receiver_thread_ = std::thread([=](){receiver_->run();});
}